

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigSplit.c
# Opt level: O2

Aig_Obj_t * Aig_NodeBddToMuxes_rec(DdManager *dd,DdNode *bFunc,Aig_Man_t *pNew,st__table *tBdd2Node)

{
  undefined8 uVar1;
  uint __line;
  int iVar2;
  Aig_Obj_t *p1;
  DdNode *key;
  char *__assertion;
  Aig_Obj_t *pNode;
  Aig_Obj_t *local_40;
  Aig_Obj_t *pNodeC;
  
  if (((ulong)bFunc & 1) != 0) {
    __assertion = "!Cudd_IsComplement(bFunc)";
    __line = 0x37;
LAB_0050b2d6:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigSplit.c"
                  ,__line,
                  "Aig_Obj_t *Aig_NodeBddToMuxes_rec(DdManager *, DdNode *, Aig_Man_t *, st__table *)"
                 );
  }
  iVar2 = st__lookup(tBdd2Node,(char *)bFunc,(char **)&pNode);
  if (iVar2 == 0) {
    local_40 = Aig_NodeBddToMuxes_rec
                         (dd,(DdNode *)((ulong)(bFunc->type).kids.E & 0xfffffffffffffffe),pNew,
                          tBdd2Node);
    uVar1 = *(undefined8 *)((long)&bFunc->type + 8);
    p1 = Aig_NodeBddToMuxes_rec(dd,(bFunc->type).kids.T,pNew,tBdd2Node);
    key = Cudd_bddIthVar(dd,bFunc->index);
    iVar2 = st__lookup(tBdd2Node,(char *)key,(char **)&pNodeC);
    if (iVar2 == 0) {
      __assertion = "0";
      __line = 0x3f;
      goto LAB_0050b2d6;
    }
    pNode = Aig_Mux(pNew,pNodeC,p1,(Aig_Obj_t *)((ulong)((uint)uVar1 & 1) ^ (ulong)local_40));
    st__insert(tBdd2Node,(char *)bFunc,(char *)pNode);
  }
  return pNode;
}

Assistant:

Aig_Obj_t * Aig_NodeBddToMuxes_rec( DdManager * dd, DdNode * bFunc, Aig_Man_t * pNew, st__table * tBdd2Node )
{
    Aig_Obj_t * pNode, * pNode0, * pNode1, * pNodeC;
    assert( !Cudd_IsComplement(bFunc) );
    if ( st__lookup( tBdd2Node, (char *)bFunc, (char **)&pNode ) )
        return pNode;
    // solve for the children nodes
    pNode0 = Aig_NodeBddToMuxes_rec( dd, Cudd_Regular(cuddE(bFunc)), pNew, tBdd2Node );
    pNode0 = Aig_NotCond( pNode0, Cudd_IsComplement(cuddE(bFunc)) );
    pNode1 = Aig_NodeBddToMuxes_rec( dd, cuddT(bFunc), pNew, tBdd2Node );
    if ( ! st__lookup( tBdd2Node, (char *)Cudd_bddIthVar(dd, bFunc->index), (char **)&pNodeC ) )
        assert( 0 );
    // create the MUX node
    pNode = Aig_Mux( pNew, pNodeC, pNode1, pNode0 );
    st__insert( tBdd2Node, (char *)bFunc, (char *)pNode );
    return pNode;
}